

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DICEPSPlanner.cpp
# Opt level: O0

void DICEPSPlanner::SampleIndividualPolicy
               (PolicyPureVector *pol,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *ohistActionProbs)

{
  bool bVar1;
  int iVar2;
  reference pdVar3;
  double prob_aI;
  const_iterator a_last;
  const_iterator a_it;
  Index aI;
  double cumulativeActionProb;
  double r;
  vector<double,_std::allocator<double>_> *action_probs;
  Index ohistI;
  const_iterator last;
  const_iterator it;
  Index in_stack_ffffffffffffff88;
  Index in_stack_ffffffffffffff8c;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  in_stack_ffffffffffffff90;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  int local_44;
  double local_40;
  double local_38;
  reference local_30;
  int local_24;
  vector<double,_std::allocator<double>_> *local_20;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (vector<double,_std::allocator<double>_> *)
       std::
       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_20 = (vector<double,_std::allocator<double>_> *)
             std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_24 = 0;
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                        *)in_stack_ffffffffffffff90._M_current,
                       (__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (!bVar1) {
      return;
    }
    local_30 = __gnu_cxx::
               __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator*(local_18);
    iVar2 = rand();
    local_38 = (double)iVar2 / 2147483647.0;
    local_40 = 0.0;
    local_44 = 0;
    local_50._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)
                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_ffffffffffffff90._M_current,
                              (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)),
          bVar1) {
      pdVar3 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*(&local_50);
      local_40 = *pdVar3 + local_40;
      if (local_38 <= local_40) break;
      local_44 = local_44 + 1;
      in_stack_ffffffffffffff98 =
           __gnu_cxx::
           __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator++(in_stack_ffffffffffffff98._M_current,
                      (int)((ulong)in_stack_ffffffffffffff90._M_current >> 0x20));
    }
    PolicyPureVector::SetAction
              ((PolicyPureVector *)in_stack_ffffffffffffff90._M_current,in_stack_ffffffffffffff8c,
               in_stack_ffffffffffffff88);
    local_24 = local_24 + 1;
    in_stack_ffffffffffffff90 =
         __gnu_cxx::
         __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
         ::operator++((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                       *)in_stack_ffffffffffffff98._M_current,
                      (int)((ulong)in_stack_ffffffffffffff90._M_current >> 0x20));
  } while( true );
}

Assistant:

void DICEPSPlanner::SampleIndividualPolicy(PolicyPureVector& pol, 
    const vector< vector<double> >&  ohistActionProbs )
{
    vector< vector<double> >::const_iterator it = ohistActionProbs.begin();
    vector< vector<double> >::const_iterator last = ohistActionProbs.end();
    Index ohistI = 0;
    while(it != last)
    {
        //the action probabilities for the type pointed to by *it
        const vector<double> & action_probs = *it;
        double r = ((double)rand()) / RAND_MAX;
        double cumulativeActionProb = 0.0;

        Index aI = 0; //the action index
        vector<double>::const_iterator a_it = action_probs.begin();
        vector<double>::const_iterator a_last = action_probs.end();
        while(a_it != a_last)
        {
            double prob_aI = *a_it;
            cumulativeActionProb += prob_aI;
            if(cumulativeActionProb >= r) //action aI is sampled
                break;
            aI++;
            a_it++;
        }
        pol.SetAction(ohistI, aI);

        ohistI++;
        it++;
    }

}